

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

int __thiscall Fl_Text_Display::position_to_line(Fl_Text_Display *this,int pos,int *lineNum)

{
  int iVar1;
  int iVar2;
  Fl_Text_Buffer *this_00;
  int local_2c;
  int i;
  int *lineNum_local;
  int pos_local;
  Fl_Text_Display *this_local;
  
  *lineNum = 0;
  if (pos < this->mFirstChar) {
    this_local._4_4_ = 0;
  }
  else if (this->mLastChar < pos) {
    iVar1 = empty_vlines(this);
    if (iVar1 == 0) {
      this_local._4_4_ = 0;
    }
    else {
      iVar1 = this->mLastChar;
      iVar2 = Fl_Text_Buffer::length(this->mBuffer);
      if (iVar1 < iVar2) {
        iVar1 = position_to_line(this,this->mLastChar,lineNum);
        if (iVar1 == 0) {
          (*Fl::error)("Fl_Text_Display::position_to_line(): Consistency check ptvl failed");
          this_local._4_4_ = 0;
        }
        else {
          iVar1 = *lineNum;
          *lineNum = iVar1 + 1;
          this_local._4_4_ = (uint)(iVar1 + 1 <= this->mNVisibleLines + -1);
        }
      }
      else {
        this_00 = buffer(this);
        iVar1 = Fl_Text_Buffer::prev_char_clipped(this_00,this->mLastChar);
        position_to_line(this,iVar1,lineNum);
        this_local._4_4_ = 1;
      }
    }
  }
  else {
    local_2c = this->mNVisibleLines;
    do {
      local_2c = local_2c + -1;
      if (local_2c < 0) {
        return 0;
      }
    } while ((this->mLineStarts[local_2c] == -1) || (pos < this->mLineStarts[local_2c]));
    *lineNum = local_2c;
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Text_Display::position_to_line( int pos, int *lineNum ) const {
  IS_UTF8_ALIGNED2(buffer(), pos)

  int i;

  *lineNum = 0;
  if ( pos < mFirstChar ) return 0;
  if ( pos > mLastChar ) {
    if ( empty_vlines() ) {
      if ( mLastChar < mBuffer->length() ) {
        if ( !position_to_line( mLastChar, lineNum ) ) {
          Fl::error("Fl_Text_Display::position_to_line(): Consistency check ptvl failed");
          return 0;
        }
        return ++( *lineNum ) <= mNVisibleLines - 1;
      } else {
        position_to_line( buffer()->prev_char_clipped(mLastChar), lineNum );
        return 1;
      }
    }
    return 0;
  }

  for ( i = mNVisibleLines - 1; i >= 0; i-- ) {
    if ( mLineStarts[ i ] != -1 && pos >= mLineStarts[ i ] ) {
      *lineNum = i;
      return 1;
    }
  }
  return 0;   /* probably never be reached */
}